

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cpp
# Opt level: O0

void __thiscall pbrt::IPCChannel::IPCChannel(IPCChannel *this,string *hostname)

{
  __int_type_conflict1 _Var1;
  char in_SIL;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RDI;
  IPCChannel *in_stack_00000008;
  size_t split;
  difference_type in_stack_ffffffffffffff20;
  string *this_00;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff28;
  allocator<char> *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff50;
  string local_88 [39];
  allocator<char> local_61;
  undefined8 local_60;
  char *local_58;
  undefined8 local_50;
  string local_48 [48];
  long local_18;
  char local_10;
  
  *(undefined4 *)in_RDI._M_current = 0;
  this_01 = (allocator<char> *)
            &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI._M_current
             )->_M_string_length;
  local_10 = in_SIL;
  std::__cxx11::string::string((string *)this_01);
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)in_RDI._M_current + 0x20))->_M_string_length;
  std::__cxx11::string::string((string *)this_02);
  *(undefined4 *)
   &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
    ((long)in_RDI._M_current + 0x40))->_M_string_length = 0xffffffff;
  _Var1 = std::__atomic_base<int>::operator++((__atomic_base<int> *)&numActiveChannels,0);
  if (_Var1 == 0) {
    signal(0xd,(__sighandler_t)0x1);
  }
  local_18 = std::__cxx11::string::find_last_of(local_10,0x3a);
  if (local_18 == -1) {
    ErrorExit<std::__cxx11::string_const&>
              (in_stack_ffffffffffffff50._M_current,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_RDI._M_current);
  }
  local_50 = std::__cxx11::string::begin();
  local_60 = std::__cxx11::string::begin();
  local_58 = (char *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            (this_02,in_stack_ffffffffffffff50,in_RDI,this_01);
  this_00 = local_48;
  std::__cxx11::string::operator=((string *)(in_RDI._M_current + 8),this_00);
  std::__cxx11::string::~string(this_00);
  std::allocator<char>::~allocator(&local_61);
  std::__cxx11::string::begin();
  __gnu_cxx::
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator+(in_stack_ffffffffffffff28,(difference_type)this_00);
  __gnu_cxx::
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator+(in_stack_ffffffffffffff28,(difference_type)this_00);
  std::__cxx11::string::end();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
            (this_02,in_stack_ffffffffffffff50,in_RDI,this_01);
  std::__cxx11::string::operator=((string *)(in_RDI._M_current + 0x28),local_88);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
  Connect(in_stack_00000008);
  return;
}

Assistant:

IPCChannel::IPCChannel(const std::string &hostname) {
    if (numActiveChannels++ == 0) {
#ifdef PBRT_IS_WINDOWS
        WSADATA wsaData;
        int err = WSAStartup(MAKEWORD(2, 2), &wsaData);
        if (err != NO_ERROR)
            LOG_FATAL("Unable to initialize WinSock: %s", ErrorString(err));
#else
        // We don't care about getting a SIGPIPE if the display server goes
        // away...
        signal(SIGPIPE, SIG_IGN);
#endif
    }

    size_t split = hostname.find_last_of(':');
    if (split == std::string::npos)
        ErrorExit("Expected \"host:port\" for display server address. Given \"%s\".",
                  hostname);
    address = std::string(hostname.begin(), hostname.begin() + split);
    port = std::string(hostname.begin() + split + 1, hostname.end());

    Connect();
}